

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

ssize_t __thiscall Hpipe::Lexer::read(Lexer *this,int __fd,void *__buf,size_t __nbytes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorList *this_00;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  Lexem *pLVar6;
  Lexem *pLVar7;
  Lexem *pLVar8;
  undefined4 in_register_00000034;
  Source *source;
  int num_grp;
  char *cur;
  long lVar9;
  Lexem *pLVar10;
  bool bVar11;
  allocator local_99;
  string local_98;
  long *local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  
  source = (Source *)CONCAT44(in_register_00000034,__fd);
  pLVar10 = &this->first_item;
  do {
    pLVar6 = pLVar10;
    pLVar10 = pLVar6->next;
  } while (pLVar6->next != (Lexem *)0x0);
  this->last = pLVar6;
  this->sibling[0] = (Lexem *)0x0;
  this->sibling[1] = (Lexem *)0x0;
  this->sibling[2] = (Lexem *)0x0;
  this->sibling[3] = (Lexem *)0x0;
  this->sibling[4] = (Lexem *)0x0;
  this->sibling[5] = (Lexem *)0x0;
  this->sibling[6] = (Lexem *)0x0;
  this->sibling[7] = (Lexem *)0x0;
  this->sibling[8] = (Lexem *)0x0;
  this->sibling[9] = (Lexem *)0x0;
  this->sibling[10] = (Lexem *)0x0;
  this->sibling[0xb] = (Lexem *)0x0;
  this->sibling[0xc] = (Lexem *)0x0;
  this->sibling[0xd] = (Lexem *)0x0;
  this->sibling[0xe] = (Lexem *)0x0;
  this->sibling[0xf] = (Lexem *)0x0;
  cur = source->data;
  if (cur == (char *)0x0) {
    this_00 = this->error_list;
    std::__cxx11::string::string((string *)&local_98,source->provenance,&local_99);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x17dcb4);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = plVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*plVar4;
    }
    lStack_70 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ErrorList::add(this_00,source,(char *)0x0,(char *)local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    do {
      iVar3 = read_tok(this,source,cur);
      cur = cur + iVar3;
    } while (iVar3 != 0);
    local_78 = (long *)0x1;
    lStack_70 = 0x100000003;
    local_68 = 0x300000003;
    lStack_60 = 0x100000002;
    lVar9 = 0xf;
    do {
      pLVar10 = this->sibling[lVar9];
      if (pLVar10 != (Lexem *)0x0) {
        iVar3 = *(int *)((long)&local_78 + lVar9 * 4);
        do {
          if (iVar3 == 3) {
            assemble_barg(this,pLVar10,1,1);
          }
          else if (iVar3 == 2) {
            assemble_rarg(this,pLVar10);
          }
          else if (iVar3 == 1) {
            assemble_larg(this,pLVar10);
          }
          pLVar10 = pLVar10->sibling;
        } while (pLVar10 != (Lexem *)0x0);
      }
      bVar11 = lVar9 != 0;
      lVar9 = lVar9 + -1;
    } while (bVar11);
    paVar1 = &local_98.field_2;
    pLVar10 = pLVar6;
    do {
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"=","");
      bVar11 = Lexem::eq(pLVar10,OPERATOR,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pLVar7 = pLVar10->next;
      pLVar8 = pLVar7;
      if (bVar11) {
        if (pLVar7 == (Lexem *)0x0) break;
        do {
          local_98._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"=","");
          bVar2 = Lexem::eq(pLVar7,OPERATOR,&local_98);
          bVar11 = true;
          if (!bVar2) {
            bVar11 = (pLVar7->type - TRAINING & 0xfffffffa) == 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (bVar11) {
            pLVar8 = pLVar10->next;
            if (pLVar7 == pLVar8) goto LAB_00174d61;
            pLVar10->children[1] = pLVar8;
            pLVar8->parent = pLVar10;
            pLVar8->prev = (Lexem *)0x0;
            pLVar7->prev->next = (Lexem *)0x0;
            pLVar7->prev = pLVar10;
            goto LAB_00174d5d;
          }
          pLVar7 = pLVar7->next;
        } while (pLVar7 != (Lexem *)0x0);
        pLVar7 = pLVar10->next;
        if (pLVar7 == (Lexem *)0x0) break;
        pLVar10->children[1] = pLVar7;
        pLVar7->parent = pLVar10;
        pLVar7->prev = (Lexem *)0x0;
        pLVar7 = (Lexem *)0x0;
LAB_00174d5d:
        pLVar10->next = pLVar7;
        pLVar8 = pLVar7;
      }
LAB_00174d61:
      pLVar10 = pLVar8;
    } while (pLVar8 != (Lexem *)0x0);
    pLVar6 = pLVar6->next;
  }
  return (ssize_t)pLVar6;
}

Assistant:

Lexem *Lexer::read( Source *source ) {
    // init
    last = &first_item;
    while ( last->next )
        last = last->next;
    Lexem *res = last;

    for( int i = 0; i < max_op_grp; ++i )
        sibling[ i ] = 0;

    // tokenize
    const char *data = source->data;
    if ( not data ) {
        error_list.add( source, 0, ( "Impossible to open " + std::string( source->provenance ) ).c_str() );
        return res;
    }

    while ( int inc = read_tok( source, data ) )
        data += inc;

    // operators
    enum { need_none = 0, need_larg = 1, need_rarg = 2, need_barg = 3 };
    int behavior[ max_op_grp ];
    #define OPERATOR( S, N, G ) behavior[ G ] = N;
    #include "Operators.h"
    #undef OPERATOR

    for( int num_grp = max_op_grp - 1; num_grp >= 0; --num_grp ) {
        for( Lexem *item = sibling[ num_grp ]; item; item = item->sibling ) {
            switch( behavior[ num_grp ] ) {
            case need_none: break;
            case need_larg: assemble_larg( item ); break;
            case need_rarg: assemble_rarg( item ); break;
            case need_barg: assemble_barg( item ); break;
            }
        }
    }

    // assemble machines
    for( Lexem *item = res; item; item = item->next ) {
        if ( item->eq( Lexem::OPERATOR, "=" ) ) {
            for( Lexem *next = item->next; ; next = next->next ) {
                if ( not next or next->eq( Lexem::OPERATOR, "=" ) or next->type == Lexem::TEST or next->type == Lexem::TRAINING or next->type == Lexem::METHODS or next->type == Lexem::FLAGS ) {
                    if ( next != item->next ) {
                        item->children[ 1 ] = item->next;
                        item->next->parent = item;
                        item->next->prev = 0;
                        if ( next ) {
                            next->prev->next = 0;
                            next->prev = item;
                        }
                        item->next = next;
                    }
                    break;
                }
            }
        }
    }

    return res->next;
}